

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primepalindrome.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  int __val;
  ulong __n;
  int i;
  size_type sVar4;
  undefined1 auVar5 [16];
  reference rVar6;
  allocator_type local_71;
  double local_70;
  vector<bool,_std::allocator<bool>_> primes;
  string local_40;
  
  local_40._M_dataplus._M_p._0_1_ = 1;
  std::vector<bool,_std::allocator<bool>_>::vector(&primes,1000,(bool *)&local_40,&local_71);
  sVar4 = 2;
  while( true ) {
    local_70 = (double)(int)sVar4;
    lVar1 = (ulong)primes.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
            ((long)primes.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            (long)primes.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                  ._M_start.super__Bit_iterator_base._M_p) * 8;
    auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar5._0_8_ = lVar1;
    auVar5._12_4_ = 0x45300000;
    if (SQRT((auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) <= local_70) break;
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](&primes,sVar4);
    if ((*rVar6._M_p & rVar6._M_mask) != 0) {
      for (__n = (ulong)(int)(local_70 * local_70);
          __n < (ulong)primes.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                ((long)primes.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                (long)primes.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
          __n = __n + sVar4) {
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](&primes,__n);
        *rVar6._M_p = *rVar6._M_p & ~rVar6._M_mask;
      }
    }
    sVar4 = sVar4 + 1;
  }
  sVar4 = (size_type)
          (~((int)primes.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                  ._M_start.super__Bit_iterator_base._M_p << 3) +
          primes.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset +
          (int)primes.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_p * 8);
  do {
    __val = (int)sVar4;
    if (__val < 2) {
LAB_001023ce:
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&primes.super__Bvector_base<std::allocator<bool>_>);
      return 0;
    }
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](&primes,sVar4);
    if ((*rVar6._M_p & rVar6._M_mask) != 0) {
      std::__cxx11::to_string(&local_40,__val);
      bVar2 = isPalindrome(&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      if (bVar2) {
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,__val);
        std::endl<char,std::char_traits<char>>(poVar3);
        goto LAB_001023ce;
      }
    }
    sVar4 = sVar4 - 1;
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {

    vector<bool> primes(1000,true);

    for(int i = 2; i<sqrt(primes.size());i++){
        if(primes[i] == true){
            for(int j = pow(i,2); j < primes.size(); j+=i){
                primes[j] = false;
            }
        }
    }

    for(int i = primes.size()-1; i >= 2; i--){
        if(primes[i]){
            if(isPalindrome(to_string(i))) {
                std::cout << i << std::endl;
                break;
            }
        }
    };
    return 0;
}